

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_dr_flac_ogg__read_page_header
                    (ma_dr_flac_read_proc onRead,void *pUserData,ma_dr_flac_ogg_page_header *pHeader
                    ,ma_uint32 *pBytesRead,ma_uint32 *pCRC32)

{
  undefined3 uVar1;
  ma_uint8 mVar2;
  ma_uint32 mVar3;
  ma_result mVar4;
  size_t sVar5;
  ma_uint8 id [4];
  
  *pBytesRead = 0;
  sVar5 = (*onRead)(pUserData,id,4);
  mVar4 = MA_AT_END;
  if (sVar5 == 4) {
    mVar3 = *pBytesRead + 4;
    while (*pBytesRead = mVar3, id != (ma_uint8  [4])0x5367674f) {
      uVar1 = id._1_3_;
      id[3] = id[3];
      mVar2 = id[3];
      id[1] = (ma_uint8)uVar1;
      id[2] = SUB31(uVar1,1);
      id[3] = SUB31(uVar1,2);
      id[0] = id[1];
      id[1] = id[2];
      id[2] = id[3];
      id = (ma_uint8  [4])CONCAT13(mVar2,id._0_3_);
      sVar5 = (*onRead)(pUserData,id + 3,1);
      if (sVar5 != 1) {
        return MA_AT_END;
      }
      mVar3 = *pBytesRead + 1;
    }
    *pCRC32 = 0x5fb0a94f;
    mVar4 = ma_dr_flac_ogg__read_page_header_after_capture_pattern
                      (onRead,pUserData,pHeader,pBytesRead,pCRC32);
  }
  return mVar4;
}

Assistant:

static ma_result ma_dr_flac_ogg__read_page_header(ma_dr_flac_read_proc onRead, void* pUserData, ma_dr_flac_ogg_page_header* pHeader, ma_uint32* pBytesRead, ma_uint32* pCRC32)
{
    ma_uint8 id[4];
    *pBytesRead = 0;
    if (onRead(pUserData, id, 4) != 4) {
        return MA_AT_END;
    }
    *pBytesRead += 4;
    for (;;) {
        if (ma_dr_flac_ogg__is_capture_pattern(id)) {
            ma_result result;
            *pCRC32 = MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32;
            result = ma_dr_flac_ogg__read_page_header_after_capture_pattern(onRead, pUserData, pHeader, pBytesRead, pCRC32);
            if (result == MA_SUCCESS) {
                return MA_SUCCESS;
            } else {
                if (result == MA_CRC_MISMATCH) {
                    continue;
                } else {
                    return result;
                }
            }
        } else {
            id[0] = id[1];
            id[1] = id[2];
            id[2] = id[3];
            if (onRead(pUserData, &id[3], 1) != 1) {
                return MA_AT_END;
            }
            *pBytesRead += 1;
        }
    }
}